

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O2

void read_log_toptenentry(int fd,nh_topten_entry *entry)

{
  char *line;
  int size;
  toptenentry tt;
  
  line = loadfile(fd,&size);
  if (line != (char *)0x0) {
    readentry(line,&tt);
    fill_nh_score_entry(&tt,entry,-1,'\0');
    free(line);
  }
  return;
}

Assistant:

void read_log_toptenentry(int fd, struct nh_topten_entry *entry)
{
    struct toptenentry tt;
    int size;
    char *line = loadfile(fd, &size);
    if (!line)
	return;
    
    readentry(line, &tt);
    fill_nh_score_entry(&tt, entry, -1, FALSE);
    free(line);
}